

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_sys_cfg_test.c
# Opt level: O0

int main(void)

{
  char *pcVar1;
  undefined1 local_4c [4];
  undefined1 local_48 [4];
  RK_U32 size_fbc_bdy;
  RK_U32 size_fbc_hdr;
  RK_U32 size_total;
  RK_U32 v_stride;
  RK_U32 h_stride_by_pixel;
  RK_U32 h_stride_by_byte;
  RK_U32 height;
  RK_U32 width;
  MppCodingType type;
  RK_S64 start;
  RK_S64 end;
  MppSysCfg cfg;
  MPP_RET ret;
  
  cfg._4_4_ = 0;
  cfg._0_4_ = 0;
  start = 0;
  _width = 0;
  height = 0x1000004;
  h_stride_by_byte = 0x1000;
  h_stride_by_pixel = 0x900;
  mpp_sys_cfg_show();
  _mpp_log_l(4,"mpp_sys_cfg_test","mpp_sys_cfg_test start\n",0);
  _width = mpp_time();
  cfg._0_4_ = mpp_sys_cfg_get(&end);
  if ((int)cfg == 0) {
    cfg._0_4_ = mpp_sys_cfg_set_u32(end,"dec_buf_chk:type",1);
    cfg._0_4_ = mpp_sys_cfg_set_u32(end,"dec_buf_chk:enable",1);
    cfg._0_4_ = mpp_sys_cfg_set_u32(end,"dec_buf_chk:type",height);
    cfg._0_4_ = mpp_sys_cfg_set_u32(end,"dec_buf_chk:fmt_codec",0);
    cfg._0_4_ = mpp_sys_cfg_set_u32(end,"dec_buf_chk:fmt_fbc",0x100000);
    cfg._0_4_ = mpp_sys_cfg_set_u32(end,"dec_buf_chk:width",h_stride_by_byte);
    cfg._0_4_ = mpp_sys_cfg_set_u32(end,"dec_buf_chk:height",h_stride_by_pixel);
    cfg._0_4_ = mpp_sys_cfg_set_u32(end,"dec_buf_chk:h_stride_by_byte",0);
    cfg._0_4_ = mpp_sys_cfg_set_u32(end,"dec_buf_chk:h_stride_by_pixel",0);
    cfg._0_4_ = mpp_sys_cfg_set_u32(end,"dec_buf_chk:cap_fbc",1);
    if ((int)cfg == 0) {
      _mpp_log_l(4,"mpp_sys_cfg_test","set readonly success, should be a failure\n",0);
    }
    else {
      mpp_sys_cfg_ioctl(end);
      cfg._0_4_ = mpp_sys_cfg_get_u32(end,"dec_buf_chk:h_stride_by_byte",&v_stride);
      cfg._0_4_ = mpp_sys_cfg_get_u32(end,"dec_buf_chk:h_stride_by_pixel",&size_total);
      cfg._0_4_ = mpp_sys_cfg_get_u32(end,"dec_buf_chk:v_stride",&size_fbc_hdr);
      cfg._0_4_ = mpp_sys_cfg_get_u32(end,"dec_buf_chk:size_total",&size_fbc_bdy);
      cfg._0_4_ = mpp_sys_cfg_get_u32(end,"dec_buf_chk:size_fbc_hdr",local_48);
      cfg._0_4_ = mpp_sys_cfg_get_u32(end,"dec_buf_chk:size_fbc_bdy",local_4c);
      cfg._0_4_ = mpp_sys_cfg_put(end);
      if ((int)cfg == 0) {
        start = mpp_time();
        _mpp_log_l(4,"mpp_sys_cfg_test","set u32 time %lld us\n",0,start - _width);
      }
      else {
        _mpp_log_l(2,"mpp_sys_cfg_test","mpp_sys_cfg_put failed\n",0);
      }
    }
  }
  else {
    _mpp_log_l(2,"mpp_sys_cfg_test","mpp_sys_cfg_get failed\n",0);
  }
  pcVar1 = "success";
  if ((int)cfg != 0) {
    pcVar1 = "failed";
  }
  _mpp_log_l(4,"mpp_sys_cfg_test","mpp_sys_cfg_test done %s\n",0,pcVar1);
  return (int)cfg;
}

Assistant:

int main()
{
    MPP_RET ret = MPP_OK;
    MppSysCfg cfg;
    RK_S64 end = 0;
    RK_S64 start = 0;
    MppCodingType type = MPP_VIDEO_CodingHEVC;
    RK_U32 width = 4096;
    RK_U32 height = 2304;
    RK_U32 h_stride_by_byte;
    RK_U32 h_stride_by_pixel;
    RK_U32 v_stride;
    RK_U32 size_total;
    RK_U32 size_fbc_hdr;
    RK_U32 size_fbc_bdy;

    mpp_sys_cfg_show();

    mpp_log("mpp_sys_cfg_test start\n");

    start = mpp_time();

    ret = mpp_sys_cfg_get(&cfg);
    if (ret) {
        mpp_err("mpp_sys_cfg_get failed\n");
        goto DONE;
    }

    /* set correct parameter */
    ret = mpp_sys_cfg_set_u32(cfg, "dec_buf_chk:type", 1);
    ret = mpp_sys_cfg_set_u32(cfg, "dec_buf_chk:enable", 1);
    ret = mpp_sys_cfg_set_u32(cfg, "dec_buf_chk:type", type);
    ret = mpp_sys_cfg_set_u32(cfg, "dec_buf_chk:fmt_codec", MPP_FMT_YUV420SP);
    ret = mpp_sys_cfg_set_u32(cfg, "dec_buf_chk:fmt_fbc", MPP_FRAME_FBC_AFBC_V1);
    ret = mpp_sys_cfg_set_u32(cfg, "dec_buf_chk:width", width);
    ret = mpp_sys_cfg_set_u32(cfg, "dec_buf_chk:height", height);
    ret = mpp_sys_cfg_set_u32(cfg, "dec_buf_chk:h_stride_by_byte", 0);
    ret = mpp_sys_cfg_set_u32(cfg, "dec_buf_chk:h_stride_by_pixel", 0);

    /* try get readonly parameter */
    ret = mpp_sys_cfg_set_u32(cfg, "dec_buf_chk:cap_fbc", 1);
    if (!ret) {
        mpp_log("set readonly success, should be a failure\n");
        goto DONE;
    }

    /* get result */
    mpp_sys_cfg_ioctl(cfg);

    ret = mpp_sys_cfg_get_u32(cfg, "dec_buf_chk:h_stride_by_byte", &h_stride_by_byte);
    ret = mpp_sys_cfg_get_u32(cfg, "dec_buf_chk:h_stride_by_pixel", &h_stride_by_pixel);
    ret = mpp_sys_cfg_get_u32(cfg, "dec_buf_chk:v_stride", &v_stride);
    ret = mpp_sys_cfg_get_u32(cfg, "dec_buf_chk:size_total", &size_total);
    ret = mpp_sys_cfg_get_u32(cfg, "dec_buf_chk:size_fbc_hdr", &size_fbc_hdr);
    ret = mpp_sys_cfg_get_u32(cfg, "dec_buf_chk:size_fbc_bdy", &size_fbc_bdy);

    ret = mpp_sys_cfg_put(cfg);
    if (ret) {
        mpp_err("mpp_sys_cfg_put failed\n");
        goto DONE;
    }

    end = mpp_time();
    mpp_log("set u32 time %lld us\n", end - start);

DONE:
    mpp_log("mpp_sys_cfg_test done %s\n", ret ? "failed" : "success");
    return ret;
}